

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestFixAllocator(void)

{
  uint __line;
  People *pPVar1;
  People *ptr;
  char *__assertion;
  FixedAllocator<People> allocator;
  
  puts("===================== TestFixAllocator BEGIN ===================");
  allocator.inited = false;
  allocator.construct = true;
  pPVar1 = tcmalloc::FixedAllocator<People>::Alloc(&allocator);
  ptr = tcmalloc::FixedAllocator<People>::Alloc(&allocator);
  if (pPVar1 == (People *)0x0) {
    __assertion = "p1 != nullptr";
    __line = 0x1b;
  }
  else if (ptr == (People *)0x0) {
    __assertion = "p2 != nullptr";
    __line = 0x1c;
  }
  else if (allocator.area_ == (char *)0x0) {
    __assertion = "old_area != nullptr";
    __line = 0x1e;
  }
  else {
    pPVar1->age_ = 0x12;
    if (allocator.freelist_ == (void *)0x0) {
      tcmalloc::FixedAllocator<People>::Free(&allocator,pPVar1);
      if (allocator.freelist_ == (void *)0x0) {
        __assertion = "!allocator.FreeListEmpty()";
        __line = 0x25;
      }
      else {
        tcmalloc::FixedAllocator<People>::Free(&allocator,ptr);
        if (allocator.freelist_ == (void *)0x0) {
          __assertion = "!allocator.FreeListEmpty()";
          __line = 0x27;
        }
        else {
          pPVar1 = tcmalloc::FixedAllocator<People>::Alloc(&allocator);
          if (pPVar1 == (People *)0x0) {
            __assertion = "allocator.Alloc() != nullptr";
            __line = 0x29;
          }
          else if (allocator.freelist_ == (void *)0x0) {
            __assertion = "!allocator.FreeListEmpty()";
            __line = 0x2a;
          }
          else {
            pPVar1 = tcmalloc::FixedAllocator<People>::Alloc(&allocator);
            if (pPVar1 == (People *)0x0) {
              __assertion = "allocator.Alloc() != nullptr";
              __line = 0x2b;
            }
            else if (allocator.freelist_ == (void *)0x0) {
              if (allocator.area_ != (char *)0x0) {
                puts("===================== TestFixAllocator PASS =====================");
                return;
              }
              __assertion = "old_area = allocator.Area()";
              __line = 0x2d;
            }
            else {
              __assertion = "allocator.FreeListEmpty()";
              __line = 0x2c;
            }
          }
        }
      }
    }
    else {
      __assertion = "allocator.FreeListEmpty()";
      __line = 0x23;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,__line,"void TestFixAllocator()");
}

Assistant:

void TestFixAllocator() {
    printf("===================== TestFixAllocator BEGIN ===================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };

    tcmalloc::FixedAllocator<People> allocator;
    People* p1 = allocator.Alloc();
    People* p2 = allocator.Alloc();
    assert(p1 != nullptr);
    assert(p2 != nullptr);
    char *old_area = allocator.Area();
    assert(old_area != nullptr);

    p1 = new (p1) People(18);
    p1->~People();

    assert(allocator.FreeListEmpty());
    allocator.Free(p1);
    assert(!allocator.FreeListEmpty());
    allocator.Free(p2);
    assert(!allocator.FreeListEmpty());

    assert(allocator.Alloc() != nullptr);
    assert(!allocator.FreeListEmpty());
    assert(allocator.Alloc() != nullptr);
    assert(allocator.FreeListEmpty());
    assert(old_area = allocator.Area());

    printf("===================== TestFixAllocator PASS =====================\n");
}